

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_path_builder_delegate_unittest.cc
# Opt level: O2

string * __thiscall
bssl::(anonymous_namespace)::
gtest_AllSimplePathBuilderDelegate1024SuccessTest_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          TestParamInfo<const_char_*> *info)

{
  bool bVar1;
  TestParamInfo<const_char_*> *extraout_RDX;
  TestParamInfo<const_char_*> *extraout_RDX_00;
  TestParamInfo<const_char_*> *info_00;
  tuple<testing::internal::ParamGenerator<const_char_*>_> t;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  bVar1 = testing::internal::AlwaysFalse();
  info_00 = extraout_RDX;
  if (bVar1) {
    testing::ValuesIn<char_const*,8ul>((testing *)&_Stack_38,(char *(*) [8])kSuccess1024Filenames);
    ::std::
    __shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_28,&_Stack_38);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    info_00 = extraout_RDX_00;
  }
  testing::internal::DefaultParamName<char_const*>(__return_storage_ptr__,(internal *)this,info_00);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(SimplePathBuilderDelegate1024SuccessTest, IsAcceptableSignatureAndKey) {
  SignatureAlgorithm signature_algorithm{};
  bssl::UniquePtr<EVP_PKEY> public_key;
  ASSERT_NO_FATAL_FAILURE(
      ReadTestCase(GetParam(), &signature_algorithm, &public_key));
  ASSERT_TRUE(public_key);

  CertErrors errors;
  SimplePathBuilderDelegate delegate(
      1024, SimplePathBuilderDelegate::DigestPolicy::kWeakAllowSha1);

  EXPECT_TRUE(
      delegate.IsSignatureAlgorithmAcceptable(signature_algorithm, &errors));

  EXPECT_TRUE(delegate.IsPublicKeyAcceptable(public_key.get(), &errors));
}